

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

void cfd::core::FindPsbtMap
               (wally_map *map_object,vector<unsigned_char,_std::allocator<unsigned_char>_> *key,
               string *field_name,size_t *index)

{
  uchar *key_00;
  size_type key_len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *__rhs;
  undefined8 uVar1;
  char *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  CfdError error_code;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  undefined1 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  CfdSourceLocation local_118;
  undefined1 local_f9;
  CfdSourceLocation local_b8;
  undefined1 local_9d;
  CfdSourceLocation local_50;
  int local_34;
  size_t sStack_30;
  int ret;
  size_t exist;
  size_t *index_local;
  string *field_name_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *key_local;
  wally_map *map_object_local;
  
  sStack_30 = 0;
  exist = (size_t)index;
  index_local = (size_t *)field_name;
  field_name_local = (string *)key;
  key_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)map_object;
  key_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)key);
  key_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)field_name_local);
  local_34 = wally_map_find(map_object,key_00,key_len,&stack0xffffffffffffffd0);
  error_code = (CfdError)((ulong)key_00 >> 0x20);
  if (local_34 != 0) {
    local_50.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_50.filename = local_50.filename + 1;
    local_50.line = 0x357;
    local_50.funcname = "FindPsbtMap";
    logger::warn<int&>(&local_50,"wally_map_find NG[{}]",&local_34);
    local_9d = 1;
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x30);
    ::std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    ::std::operator+(__lhs,in_stack_fffffffffffffe80);
    CfdException::CfdException
              ((CfdException *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
               error_code,(string *)map_object);
    local_9d = 0;
    __cxa_throw(__lhs,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if ((exist == 0) && (sStack_30 != 0)) {
    local_b8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_b8.filename = local_b8.filename + 1;
    local_b8.line = 0x35c;
    local_b8.funcname = "FindPsbtMap";
    logger::warn<std::__cxx11::string_const&>
              (&local_b8,"{} duplicates.",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)index_local);
    local_f9 = 1;
    __rhs = (char *)__cxa_allocate_exception(0x30);
    ::std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    ::std::operator+(in_stack_fffffffffffffe88,__rhs);
    CfdException::CfdException
              ((CfdException *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
               error_code,(string *)map_object);
    local_f9 = 0;
    __cxa_throw(__rhs,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (exist != 0) {
    if (sStack_30 == 0) {
      local_118.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      local_118.filename = local_118.filename + 1;
      local_118.line = 0x361;
      local_118.funcname = "FindPsbtMap";
      logger::warn<std::__cxx11::string_const&>
                (&local_118,"{} not found.",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)index_local);
      uVar2 = 1;
      uVar1 = __cxa_allocate_exception(0x30);
      ::std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      ::std::operator+(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      CfdException::CfdException
                ((CfdException *)CONCAT17(uVar2,in_stack_fffffffffffffea0),error_code,
                 (string *)map_object);
      __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
    }
    *(size_t *)exist = sStack_30 - 1;
  }
  return;
}

Assistant:

static void FindPsbtMap(
    const struct wally_map *map_object, const std::vector<uint8_t> &key,
    const std::string &field_name, size_t *index = nullptr) {
  size_t exist = 0;
  int ret = wally_map_find(map_object, key.data(), key.size(), &exist);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_map_find NG[{}]", ret);
    throw CfdException(
        kCfdInternalError, "psbt find " + field_name + " error.");
  }
  if ((index == nullptr) && (exist != 0)) {
    warn(CFD_LOG_SOURCE, "{} duplicates.", field_name);
    throw CfdException(
        kCfdIllegalArgumentError, "psbt " + field_name + " duplicates error.");
  } else if (index != nullptr) {
    if (exist == 0) {
      warn(CFD_LOG_SOURCE, "{} not found.", field_name);
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt " + field_name + " not found error.");
    }
    *index = exist - 1;
  }
}